

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::processingWord(CScanner *this,char c)

{
  bool bVar1;
  
  bVar1 = IsWordLetter(c);
  if (bVar1) {
    std::__cxx11::string::push_back((char)this + -0x50);
    return;
  }
  (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type =
       TT_Word;
  CParser::AddToken(&this->super_CParser);
  this->state = S_Initial;
  processing(this,c);
  return;
}

Assistant:

void CScanner::processingWord( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else {
		addToken( TT_Word );
		state = S_Initial;
		processing( c );
	}
}